

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

Abc_ShaMan_t * Abc_ShaManStart(Abc_Ntk_t *pNtk)

{
  Abc_ShaMan_t *pAVar1;
  Vec_Int_t *pVVar2;
  Abc_ShaMan_t *p;
  Abc_Ntk_t *pNtk_local;
  
  pAVar1 = (Abc_ShaMan_t *)calloc(1,0x30);
  pAVar1->pNtk = pNtk;
  pVVar2 = Vec_IntAlloc(1000);
  pAVar1->vObj2Lit = pVVar2;
  return pAVar1;
}

Assistant:

Abc_ShaMan_t * Abc_ShaManStart( Abc_Ntk_t * pNtk )
{
    Abc_ShaMan_t * p;
    p = ABC_CALLOC( Abc_ShaMan_t, 1 );
    p->pNtk      = pNtk;
    p->vObj2Lit  = Vec_IntAlloc( 1000 );
    return p;
}